

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O1

void __thiscall bsplib::Rdma::ActionBuf::clear(ActionBuf *this)

{
  pointer pAVar1;
  pointer puVar2;
  pointer puVar3;
  
  this->m_dummy_bsmp = 0;
  pAVar1 = (this->m_actions).
           super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_actions).
      super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    (this->m_actions).
    super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  puVar2 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    memset(puVar2,0,((long)puVar3 + (-8 - (long)puVar2) & 0xfffffffffffffff8U) + 8);
  }
  puVar2 = (this->m_get_buffer_offset).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->m_get_buffer_offset).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    memset(puVar2,0,((long)puVar3 + (-8 - (long)puVar2) & 0xfffffffffffffff8U) + 8);
    return;
  }
  return;
}

Assistant:

void clear() 
        {
            m_dummy_bsmp = false;
            m_actions.clear();
            std::fill( m_counts.begin(), m_counts.end(), 0);
            std::fill( m_get_buffer_offset.begin(), m_get_buffer_offset.end(), 0);
        }